

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
project::get_export_formats_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,project *this)

{
  bool bVar1;
  const_iterator pxVar2;
  xml_node *pxVar3;
  char_t *pcVar4;
  xml_node child;
  xpath_node node;
  xpath_node_set xformats;
  allocator local_e9;
  const_iterator local_e8;
  xml_node local_e0;
  undefined1 local_d8 [32];
  xml_node_iterator local_b8;
  xml_node_iterator local_a8;
  xpath_node local_98;
  xpath_node_set local_80;
  xml_node_struct *local_58;
  xml_node_struct *pxStack_50;
  xml_node_struct *local_48;
  xml_node_struct *pxStack_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pugi::xml_node::select_nodes
            (&local_80,(xml_node *)this,"/JUCERPROJECT/EXPORTFORMATS",(xpath_variable_set *)0x0);
  local_e8 = pugi::xpath_node_set::begin(&local_80);
  while( true ) {
    pxVar2 = pugi::xpath_node_set::end(&local_80);
    if (local_e8 == pxVar2) break;
    local_98._node._root = (local_e8->_node)._root;
    local_98._attribute._attr = (local_e8->_attribute)._attr;
    local_d8._0_8_ = pugi::xpath_node::node(&local_98);
    pugi::xml_node::children((xml_node *)local_d8);
    local_a8._wrap._root = local_58;
    local_a8._parent._root = pxStack_50;
    local_b8._wrap._root = local_48;
    local_b8._parent._root = pxStack_40;
    while( true ) {
      bVar1 = pugi::xml_node_iterator::operator!=(&local_a8,&local_b8);
      if (!bVar1) break;
      pxVar3 = pugi::xml_node_iterator::operator*(&local_a8);
      local_e0._root = pxVar3->_root;
      pcVar4 = pugi::xml_node::name(&local_e0);
      std::__cxx11::string::string((string *)local_d8,pcVar4,&local_e9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      if ((xml_node_struct *)local_d8._0_8_ != (xml_node_struct *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
      pugi::xml_node_iterator::operator++(&local_a8);
    }
    local_e8 = local_e8 + 1;
  }
  pugi::xpath_node_set::~xpath_node_set(&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> project::get_export_formats()
{
    std::vector<std::string> res;

    pugi::xpath_node_set xformats = m_Doc.select_nodes("/JUCERPROJECT/EXPORTFORMATS");

    for (pugi::xpath_node_set::const_iterator it = xformats.begin(); it != xformats.end(); ++it)
    {
        pugi::xpath_node node = *it;
        for (pugi::xml_node child: node.node().children())
        {
            res.push_back(child.name());
        }
    }

    return res;
}